

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_int_CXX.cxx
# Opt level: O2

int test_int_CXX(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  char *pcVar14;
  byte bVar15;
  char *pcVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  int8_t y;
  byte local_23a;
  int8_t local_239;
  short local_238;
  short local_236;
  short local_234;
  undefined1 local_232;
  byte local_231;
  int8_t local_230;
  int8_t local_22f;
  int8_t local_22e;
  int8_t local_22d;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  short local_1fe;
  short local_1fc;
  short local_1fa;
  ulong local_1f8;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  ulong local_140;
  char buf [256];
  
  uVar17 = 0;
  snprintf(buf,0x100,"%i",0xffffffffffffffab);
  printf("C++ KWIML_INT_PRIi8: expected [%s], got [%s]","-85",buf);
  local_144._0_1_ = buf[0];
  local_144._1_1_ = buf[1];
  local_144._2_1_ = buf[2];
  local_144._3_1_ = buf[3];
  pcVar14 = ", FAILED";
  if (buf._0_4_ == 0x35382d) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-85","%hhi",&y);
  if (iVar8 == 1) {
    uVar17 = (uint)y;
  }
  else {
    _y = _y & 0xffffffffffffff00;
  }
  uVar13 = 0;
  printf("C++ KWIML_INT_SCNi8: expected [%i], got [%i]",0xffffffab,(ulong)uVar17);
  local_22d = y;
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%d",0xffffffab);
  printf("C++ KWIML_INT_PRId8: expected [%s], got [%s]","-85",buf);
  local_148._0_1_ = buf[0];
  local_148._1_1_ = buf[1];
  local_148._2_1_ = buf[2];
  local_148._3_1_ = buf[3];
  pcVar14 = ", FAILED";
  if (buf._0_4_ == 0x35382d) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-85","%hhd",&y);
  if (iVar8 == 1) {
    uVar13 = (uint)y;
  }
  else {
    _y = _y & 0xffffffffffffff00;
  }
  uVar10 = 0;
  printf("C++ KWIML_INT_SCNd8: expected [%d], got [%d]",0xffffffffffffffab,(ulong)uVar13);
  local_22e = y;
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%o",0xab);
  printf("C++ KWIML_INT_PRIo8: expected [%s], got [%s]","253",buf);
  local_14c._0_1_ = buf[0];
  local_14c._1_1_ = buf[1];
  local_14c._2_1_ = buf[2];
  local_14c._3_1_ = buf[3];
  pcVar14 = ", FAILED";
  if (buf._0_4_ == 0x333532) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("253","%hho",&y);
  if (iVar8 == 1) {
    uVar10 = _y & 0xff;
  }
  else {
    _y = _y & 0xffffffffffffff00;
  }
  uVar11 = 0;
  printf("C++ KWIML_INT_SCNo8: expected [%o], got [%o]",0xab,uVar10);
  local_22f = y;
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%u",0xab);
  printf("C++ KWIML_INT_PRIu8: expected [%s], got [%s]","171",buf);
  local_150._0_1_ = buf[0];
  local_150._1_1_ = buf[1];
  local_150._2_1_ = buf[2];
  local_150._3_1_ = buf[3];
  pcVar14 = ", FAILED";
  if (buf._0_4_ == 0x313731) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("171","%hhu",&y);
  if (iVar8 == 1) {
    uVar11 = _y & 0xff;
  }
  else {
    _y = _y & 0xffffffffffffff00;
  }
  printf("C++ KWIML_INT_SCNu8: expected [%u], got [%u]",0xab,uVar11);
  local_23a = y;
  pcVar16 = ", FAILED";
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%x",0xab);
  printf("C++ KWIML_INT_PRIx8: expected [%s], got [%s]","ab",buf);
  local_204 = bcmp("ab",buf,3);
  pcVar14 = ", FAILED";
  if (local_204 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%X",0xab);
  printf("C++ KWIML_INT_PRIX8: expected [%s], got [%s]","AB",buf);
  local_154 = bcmp("AB",buf,3);
  if (local_154 == 0) {
    pcVar16 = ", PASSED";
  }
  puts(pcVar16);
  iVar8 = __isoc99_sscanf("ab","%hhx",&y);
  if (iVar8 == 1) {
    uVar10 = _y & 0xff;
  }
  else {
    _y = _y & 0xffffffffffffff00;
    uVar10 = 0;
  }
  uVar11 = 0;
  printf("C++ KWIML_INT_SCNx8: expected [%x], got [%x]",0xab,uVar10);
  local_239 = y;
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("AB","%hhx",&y);
  if (iVar8 == 1) {
    uVar11 = _y & 0xff;
  }
  else {
    _y = _y & 0xffffffffffffff00;
  }
  uVar17 = 0;
  printf("C++ KWIML_INT_SCNx8: expected [%X], got [%X]",0xab,uVar11);
  local_230 = y;
  pcVar14 = ", FAILED";
  if (y == -0x55) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%i",0xffffab00);
  printf("C++ KWIML_INT_PRIi16: expected [%s], got [%s]","-21760",buf);
  local_208 = bcmp("-21760",buf,7);
  pcVar14 = ", FAILED";
  if (local_208 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-21760","%hi",&y);
  if (iVar8 == 1) {
    uVar17 = (uint)_y;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar13 = 0;
  printf("C++ KWIML_INT_SCNi16: expected [%i], got [%i]",0xffffab00,(ulong)uVar17);
  local_1fa = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%d",0xffffab00);
  printf("C++ KWIML_INT_PRId16: expected [%s], got [%s]","-21760",buf);
  local_20c = bcmp("-21760",buf,7);
  pcVar14 = ", FAILED";
  if (local_20c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-21760","%hd",&y);
  if (iVar8 == 1) {
    uVar13 = (uint)_y;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar10 = 0;
  printf("C++ KWIML_INT_SCNd16: expected [%d], got [%d]",0xffffab00,(ulong)uVar13);
  local_234 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%o",0xab00);
  printf("C++ KWIML_INT_PRIo16: expected [%s], got [%s]","125400",buf);
  local_22c = bcmp("125400",buf,7);
  pcVar14 = ", FAILED";
  if (local_22c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("125400","%ho",&y);
  if (iVar8 == 1) {
    uVar10 = _y & 0xffff;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar11 = 0;
  printf("C++ KWIML_INT_SCNo16: expected [%o], got [%o]",0xab00,uVar10);
  local_236 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%u",0xab00);
  printf("C++ KWIML_INT_PRIu16: expected [%s], got [%s]","43776",buf);
  local_158 = bcmp("43776",buf,6);
  pcVar14 = ", FAILED";
  if (local_158 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("43776","%hu",&y);
  if (iVar8 == 1) {
    uVar11 = _y & 0xffff;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar10 = 0;
  printf("C++ KWIML_INT_SCNu16: expected [%u], got [%u]",0xab00,uVar11);
  local_238 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%x",0xab00);
  printf("C++ KWIML_INT_PRIx16: expected [%s], got [%s]","ab00",buf);
  local_15c = bcmp("ab00",buf,5);
  pcVar14 = ", FAILED";
  if (local_15c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("ab00","%hx",&y);
  if (iVar8 == 1) {
    uVar10 = _y & 0xffff;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar11 = 0;
  printf("C++ KWIML_INT_SCNx16: expected [%x], got [%x]",0xab00,uVar10);
  local_1fc = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%X",0xab00);
  printf("C++ KWIML_INT_PRIX16: expected [%s], got [%s]","AB00",buf);
  local_210 = bcmp("AB00",buf,5);
  pcVar14 = ", FAILED";
  if (local_210 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("AB00","%hx",&y);
  if (iVar8 == 1) {
    uVar11 = _y & 0xffff;
  }
  else {
    _y = _y & 0xffffffffffff0000;
  }
  uVar17 = 0;
  printf("C++ KWIML_INT_SCNx16: expected [%X], got [%X]",0xab00,uVar11);
  local_1fe = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x5500) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%i",0xab000000);
  printf("C++ KWIML_INT_PRIi32: expected [%s], got [%s]","-1426063360",buf);
  local_214 = bcmp("-1426063360",buf,0xc);
  pcVar14 = ", FAILED";
  if (local_214 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-1426063360","%i",&y);
  if (iVar8 == 1) {
    uVar17 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  uVar13 = 0;
  printf("C++ KWIML_INT_SCNi32: expected [%i], got [%i]",0xab000000,(ulong)uVar17);
  local_218 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x55000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%d",0xab000000);
  printf("C++ KWIML_INT_PRId32: expected [%s], got [%s]","-1426063360",buf);
  local_160 = bcmp("-1426063360",buf,0xc);
  pcVar14 = ", FAILED";
  if (local_160 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-1426063360","%d",&y);
  if (iVar8 == 1) {
    uVar13 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  uVar17 = 0;
  printf("C++ KWIML_INT_SCNd32: expected [%d], got [%d]",0xab000000,(ulong)uVar13);
  local_1e4 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%o",0xab000000);
  printf("C++ KWIML_INT_PRIo32: expected [%s], got [%s]","25300000000",buf);
  local_164 = bcmp("25300000000",buf,0xc);
  pcVar14 = ", FAILED";
  if (local_164 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("25300000000","%o",&y);
  if (iVar8 == 1) {
    uVar17 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  uVar13 = 0;
  printf("C++ KWIML_INT_SCNo32: expected [%o], got [%o]",0xab000000,(ulong)uVar17);
  local_168 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x55000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%u",0xab000000);
  printf("C++ KWIML_INT_PRIu32: expected [%s], got [%s]","2868903936",buf);
  local_16c = bcmp("2868903936",buf,0xb);
  pcVar14 = ", FAILED";
  if (local_16c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("2868903936","%u",&y);
  if (iVar8 == 1) {
    uVar13 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  uVar17 = 0;
  printf("C++ KWIML_INT_SCNu32: expected [%u], got [%u]",0xab000000,(ulong)uVar13);
  local_170 = _y;
  pcVar14 = ", FAILED";
  if (_y == -0x55000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%x",0xab000000);
  printf("C++ KWIML_INT_PRIx32: expected [%s], got [%s]","ab000000",buf);
  local_174 = bcmp("ab000000",buf,9);
  pcVar14 = ", FAILED";
  if (local_174 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("ab000000","%x",&y);
  if (iVar8 == 1) {
    uVar17 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  uVar13 = 0;
  printf("C++ KWIML_INT_SCNx32: expected [%x], got [%x]",0xab000000,(ulong)uVar17);
  local_1e8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%X",0xab000000);
  printf("C++ KWIML_INT_PRIX32: expected [%s], got [%s]","AB000000",buf);
  local_178 = bcmp("AB000000",buf,9);
  pcVar14 = ", FAILED";
  if (local_178 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("AB000000","%x",&y);
  if (iVar8 == 1) {
    uVar13 = _y;
  }
  else {
    _y = _y & 0xffffffff00000000;
  }
  printf("C++ KWIML_INT_SCNx32: expected [%X], got [%X]",0xab000000,(ulong)uVar13);
  local_1ec = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%li",0xab00000000000000);
  printf("C++ KWIML_INT_PRIi64: expected [%s], got [%s]","-6124895493223874560",buf);
  local_17c = bcmp("-6124895493223874560",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_17c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-6124895493223874560","%li",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNi64: expected [%li], got [%li]",0xab00000000000000,_y);
  local_1a0 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%ld",0xab00000000000000);
  printf("C++ KWIML_INT_PRId64: expected [%s], got [%s]","-6124895493223874560",buf);
  local_21c = bcmp("-6124895493223874560",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_21c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-6124895493223874560","%ld",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNd64: expected [%ld], got [%ld]",0xab00000000000000,_y);
  local_1f8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lo",0xab00000000000000);
  printf("C++ KWIML_INT_PRIo64: expected [%s], got [%s]","1254000000000000000000",buf);
  local_220 = bcmp("1254000000000000000000",buf,0x17);
  pcVar14 = ", FAILED";
  if (local_220 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("1254000000000000000000","%lo",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNo64: expected [%lo], got [%lo]",0xab00000000000000,_y);
  local_1a8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lu",0xab00000000000000);
  printf("C++ KWIML_INT_PRIu64: expected [%s], got [%s]","12321848580485677056",buf);
  local_180 = bcmp("12321848580485677056",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_180 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("12321848580485677056","%lu",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNu64: expected [%lu], got [%lu]",0xab00000000000000,_y);
  local_1b0 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lx",0xab00000000000000);
  printf("C++ KWIML_INT_PRIx64: expected [%s], got [%s]","ab00000000000000",buf);
  local_184 = bcmp("ab00000000000000",buf,0x11);
  pcVar14 = ", FAILED";
  if (local_184 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lX",0xab00000000000000);
  printf("C++ KWIML_INT_PRIX64: expected [%s], got [%s]","AB00000000000000",buf);
  local_188 = bcmp("AB00000000000000",buf,0x11);
  pcVar14 = ", FAILED";
  if (local_188 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("ab00000000000000","%lx",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNx64: expected [%lx], got [%lx]",0xab00000000000000,_y);
  local_1b8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("AB00000000000000","%lx",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNx64: expected [%lX], got [%lX]",0xab00000000000000,_y);
  local_1c0 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%li",0xab00000000000000);
  printf("C++ KWIML_INT_PRIiPTR: expected [%s], got [%s]","-6124895493223874560",buf);
  local_194 = bcmp("-6124895493223874560",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_194 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-6124895493223874560","%li",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNiPTR: expected [%li], got [%li]",0xab00000000000000,_y);
  local_1c8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%ld",0xab00000000000000);
  printf("C++ KWIML_INT_PRIdPTR: expected [%s], got [%s]","-6124895493223874560",buf);
  local_18c = bcmp("-6124895493223874560",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_18c == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("-6124895493223874560","%ld",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNdPTR: expected [%ld], got [%ld]",0xab00000000000000,_y);
  local_1d0 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lo",0xab00000000000000);
  printf("C++ KWIML_INT_PRIoPTR: expected [%s], got [%s]","1254000000000000000000",buf);
  local_190 = bcmp("1254000000000000000000",buf,0x17);
  pcVar14 = ", FAILED";
  if (local_190 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("1254000000000000000000","%lo",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNoPTR: expected [%lo], got [%lo]",0xab00000000000000,_y);
  local_1d8 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lu",0xab00000000000000);
  printf("C++ KWIML_INT_PRIuPTR: expected [%s], got [%s]","12321848580485677056",buf);
  local_228 = bcmp("12321848580485677056",buf,0x15);
  pcVar14 = ", FAILED";
  if (local_228 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("12321848580485677056","%lu",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNuPTR: expected [%lu], got [%lu]",0xab00000000000000,_y);
  local_1e0 = _y;
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lx",0xab00000000000000);
  printf("C++ KWIML_INT_PRIxPTR: expected [%s], got [%s]","ab00000000000000",buf);
  local_224 = bcmp("ab00000000000000",buf,0x11);
  pcVar14 = ", FAILED";
  if (local_224 == 0) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  iVar8 = __isoc99_sscanf("ab00000000000000","%lx",&y);
  if (iVar8 != 1) {
    _y = 0;
  }
  printf("C++ KWIML_INT_SCNxPTR: expected [%lx], got [%lx]",0xab00000000000000,_y);
  uVar10 = _y;
  pcVar16 = ", FAILED";
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  puts(pcVar14);
  snprintf(buf,0x100,"%lX",0xab00000000000000);
  printf("C++ KWIML_INT_PRIXPTR: expected [%s], got [%s]","AB00000000000000",buf);
  iVar8 = bcmp("AB00000000000000",buf,0x11);
  if (iVar8 == 0) {
    pcVar16 = ", PASSED";
  }
  puts(pcVar16);
  iVar9 = __isoc99_sscanf("AB00000000000000","%lx",&y);
  if (iVar9 == 1) {
    local_140 = _y;
  }
  else {
    local_140 = 0;
  }
  local_231 = iVar8 == 0;
  local_232 = uVar10 == 0xab00000000000000;
  bVar18 = local_224 == 0;
  local_224 = CONCAT31(local_224._1_3_,bVar18);
  bVar19 = local_1e0 == 0xab00000000000000;
  local_1e0 = CONCAT71(local_1e0._1_7_,bVar19);
  bVar20 = local_228 == 0;
  local_228 = CONCAT31(local_228._1_3_,bVar20);
  bVar21 = local_1d8 == 0xab00000000000000;
  local_1d8 = CONCAT71(local_1d8._1_7_,bVar21);
  bVar22 = local_1d0 == 0xab00000000000000;
  local_1d0 = CONCAT71(local_1d0._1_7_,bVar22);
  bVar23 = local_1c8 == 0xab00000000000000;
  local_1c8 = CONCAT71(local_1c8._1_7_,bVar23);
  bVar24 = local_194 == 0;
  bVar25 = local_1c0 == 0xab00000000000000;
  local_1c0 = CONCAT71(local_1c0._1_7_,bVar25);
  bVar26 = local_1b8 == 0xab00000000000000;
  local_1b8 = CONCAT71(local_1b8._1_7_,bVar26);
  bVar27 = local_1b0 == 0xab00000000000000;
  local_1b0 = CONCAT71(local_1b0._1_7_,bVar27);
  bVar28 = local_1a8 == 0xab00000000000000;
  local_1a8 = CONCAT71(local_1a8._1_7_,bVar28);
  bVar29 = local_220 == 0;
  local_220 = CONCAT31(local_220._1_3_,bVar29);
  bVar30 = local_21c == 0;
  local_21c = CONCAT31(local_21c._1_3_,bVar30);
  bVar31 = local_1a0 == 0xab00000000000000;
  local_1a0 = CONCAT71(local_1a0._1_7_,bVar31);
  local_1ec = local_1ec ^ 0xab000000;
  local_1e8 = local_1e8 ^ 0xab000000;
  local_1e4 = local_1e4 ^ 0xab000000;
  bVar32 = local_218 == -0x55000000;
  local_218 = CONCAT31(local_218._1_3_,bVar32);
  bVar33 = local_214 == 0;
  local_214 = CONCAT31(local_214._1_3_,bVar33);
  bVar34 = local_1fe == -0x5500;
  bVar35 = local_210 == 0;
  local_210 = CONCAT31(local_210._1_3_,bVar35);
  bVar36 = local_1fc == -0x5500;
  bVar37 = local_238 == -0x5500;
  local_238 = CONCAT11(local_238._1_1_,bVar37);
  bVar38 = local_236 == -0x5500;
  local_236 = CONCAT11(local_236._1_1_,bVar38);
  bVar39 = local_234 == -0x5500;
  local_234 = CONCAT11(local_234._1_1_,bVar39);
  bVar40 = local_20c == 0;
  local_20c = CONCAT31(local_20c._1_3_,bVar40);
  bVar41 = local_208 == 0;
  local_208 = CONCAT31(local_208._1_3_,bVar41);
  local_239 = local_239 == -0x55;
  bVar42 = local_204 == 0;
  local_204 = CONCAT31(local_204._1_3_,bVar42);
  local_23a = (local_23a == -0x55 && bVar42) &&
              (((local_14c == 0x333532 && local_22f == -0x55) && local_150 == 0x313731) &&
              ((local_148 == 0x35382d && local_22e == -0x55) &&
              (local_144 == 0x35382d && local_22d == -0x55)));
  local_22c = CONCAT31(local_22c._1_3_,
                       (local_22c == 0 && bVar38) &&
                       (((local_1fa == -0x5500 && bVar40) && bVar39) &&
                       ((local_230 == -0x55 && bVar41) && (local_154 == 0 && (bool)local_239))));
  bVar38 = local_15c == 0;
  bVar39 = local_158 == 0;
  bVar42 = local_170 == -0x55000000;
  bVar1 = local_174 == 0;
  bVar3 = local_168 == -0x55000000;
  bVar4 = local_16c == 0;
  bVar5 = local_164 == 0;
  bVar6 = local_160 == 0;
  bVar2 = local_1e4 == 0;
  bVar41 = local_1e8 == 0;
  local_1f8 = CONCAT71(local_1f8._1_7_,
                       ((local_1f8 == 0xab00000000000000 && bVar29) && bVar28) &&
                       ((bVar31 && bVar30) && ((local_17c == 0 && local_178 == 0) && local_1ec == 0)
                       ));
  bVar31 = local_184 == 0;
  bVar40 = local_180 == 0;
  bVar28 = local_188 == 0;
  bVar29 = local_190 == 0;
  bVar30 = local_18c == 0;
  bVar18 = (bVar19 && bVar18) && (bool)local_232;
  _y = local_140;
  printf("C++ KWIML_INT_SCNxPTR: expected [%lX], got [%lX]",0xab00000000000000,local_140);
  pcVar14 = ", FAILED";
  if (_y == 0xab00000000000000) {
    pcVar14 = ", PASSED";
  }
  bVar7 = _y == 0xab00000000000000 & local_231;
  bVar15 = ((bVar24 && bVar23) && ((bVar26 && bVar25) && (((bVar31 && bVar40) && bVar28) && bVar27))
           ) & (byte)local_1f8;
  bVar12 = (byte)local_22c & local_23a;
  puts(pcVar14);
  printf("C++ KWIML_INT_INT8_C: expression [%i], literal [%i]",0xffffffab);
  puts(", PASSED");
  printf("C++ KWIML_INT_UINT8_C: expression [%u], literal [%u]",0xab,0xab);
  puts(", PASSED");
  printf("C++ KWIML_INT_INT16_C: expression [%i], literal [%i]",0xffffab00,0xffffab00);
  puts(", PASSED");
  printf("C++ KWIML_INT_UINT16_C: expression [%u], literal [%u]",0xab00,0xab00);
  puts(", PASSED");
  printf("C++ KWIML_INT_INT32_C: expression [%i], literal [%i]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C++ KWIML_INT_UINT32_C: expression [%u], literal [%u]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C++ KWIML_INT_INT64_C: expression [%li], literal [%li]",0xab00000000000000,
         0xab00000000000000);
  puts(", PASSED");
  printf("C++ KWIML_INT_UINT64_C: expression [%lu], literal [%lu]",0xab00000000000000,
         0xab00000000000000);
  puts(", PASSED");
  return (int)(bVar12 & ((((bVar42 && bVar1) && ((bVar3 && bVar4) && ((bVar5 && bVar6) && bVar2)))
                         && bVar41) &&
                        (((bVar34 && bVar33) && bVar32) &&
                        ((bVar36 && bVar35) && ((bVar38 && bVar39) && bVar37)))) &
                        bVar15 & bVar7 & (bVar18 &&
                                         ((bVar21 && bVar20) && ((bVar29 && bVar30) && bVar22))));
}

Assistant:

int test_int_CXX(void)
{
  if(!test_int_format())
    {
    return 0;
    }
  return 1;
}